

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5PutVarint(uchar *p,u64 v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 uStack_20;
  undefined1 *puStack_18;
  undefined2 uStack_10;
  long lStack_8;
  
  bVar5 = (byte)v;
  if (v < 0x80) {
    *p = bVar5;
    return 1;
  }
  if (0x3fff < v) {
    lStack_8 = *(long *)(in_FS_OFFSET + 0x28);
    puStack_18 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_10 = 0xaaaa;
    if (v >> 0x38 == 0) {
      lVar2 = 0;
      do {
        lVar3 = lVar2;
        *(byte *)((long)&puStack_18 + lVar3) = (byte)v | 0x80;
        lVar2 = lVar3 + 1;
        bVar1 = 0x7f < v;
        v = v >> 7;
      } while (bVar1);
      puStack_18 = (undefined1 *)((ulong)puStack_18 & 0xffffffffffffff7f);
      lVar3 = lVar3 + 2;
      lVar4 = lVar2;
      do {
        *p = *(uchar *)((long)&uStack_20 + lVar3 + 6);
        p = p + 1;
        lVar3 = lVar3 + -1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    else {
      p[8] = bVar5;
      uVar6 = v >> 8;
      lVar2 = 8;
      do {
        p[lVar2 + -1] = (byte)uVar6 | 0x80;
        uVar6 = uVar6 >> 7;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      lVar2 = 9;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lStack_8) {
      uStack_20 = sqlite3Fts5StorageConfigValue;
      __stack_chk_fail();
    }
    return (int)lVar2;
  }
  *p = (byte)(v >> 7) | 0x80;
  p[1] = bVar5 & 0x7f;
  return 2;
}

Assistant:

static int sqlite3Fts5PutVarint(unsigned char *p, u64 v){
  if( v<=0x7f ){
    p[0] = v&0x7f;
    return 1;
  }
  if( v<=0x3fff ){
    p[0] = ((v>>7)&0x7f)|0x80;
    p[1] = v&0x7f;
    return 2;
  }
  return fts5PutVarint64(p,v);
}